

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin.cpp
# Opt level: O2

Track * complete(Track *track)

{
  pointer pSVar1;
  int iVar2;
  DataList *this;
  pointer this_00;
  uint8_t fill;
  value_type local_4a;
  allocator_type local_49;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  local_4a = '\0';
  pSVar1 = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pSVar1; this_00 = this_00 + 1) {
    iVar2 = Sector::copies(this_00);
    if (iVar2 == 0) {
      iVar2 = Sector::size(this_00);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,(long)iVar2,
                 &local_4a,&local_49);
      Sector::add(this_00,(Data *)&local_48,false,0xfb);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
    }
    else {
      iVar2 = Sector::data_size(this_00);
      if (iVar2 == 0) {
        this = Sector::datas(this_00);
        std::vector<Data,_std::allocator<Data>_>::clear(this);
      }
    }
    local_4a = local_4a + '\x01';
  }
  return track;
}

Assistant:

static Track& complete(Track& track)
{
    uint8_t fill = 0;

    for (auto& sector : track)
    {
        // Add test data to sectors that lack it
        if (!sector.copies())
            sector.add(Data(sector.size(), fill));

        // Remove data from sectors with 0 bytes of data (for no-data sectors)
        else if (!sector.data_size())
            sector.datas().clear();

        ++fill;
    }

    return track;
}